

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listenable_impl.hpp
# Opt level: O2

void __thiscall
wigwag::detail::
listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
::finalize_nodes(listenable_impl<std::shared_ptr<IObservableDictionaryListener<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_wigwag::exception_handling::print_to_stderr,_wigwag::threading::shared_recursive_mutex,_wigwag::state_populating::populator_only,_wigwag::life_assurance::intrusive_life_tokens,_wigwag::ref_counter::atomic>
                 *this)

{
  intrusive_list_node *piVar1;
  intrusive_list_node *piVar2;
  
  piVar2 = (this->_handlers)._root._next;
  while (piVar2 != &(this->_handlers)._root) {
    piVar1 = piVar2->_next;
    handler_node::finalize_node((handler_node *)&piVar2[-2]._next);
    piVar2 = piVar1;
  }
  return;
}

Assistant:

void finalize_nodes()
        {
            for (auto it = _handlers.begin(); it != _handlers.end();)
                (it++)->finalize_node();
        }